

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O0

void convert(vector<const_char_*,_std::allocator<const_char_*>_> *in,
            vector<const_char_*,_std::allocator<const_char_*>_> *views,char *outname,bool override)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  invalid_argument *piVar6;
  reference ppcVar7;
  Header *pHVar8;
  reference pvVar9;
  string *psVar10;
  reference pvVar11;
  string *psVar12;
  Channel *pCVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *pvVar17;
  byte in_CL;
  char *in_RDX;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDI;
  OutputPart outpart;
  size_t i_3;
  InputPart inpart;
  MultiPartOutputFile outfile;
  size_t samplesize;
  Header *h_2;
  ConstIterator chan;
  int part;
  size_t i_2;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  channelstore;
  int pixel_base;
  int pixel_width;
  int pixel_count;
  Box2i dataWindow;
  ConstIterator i_1;
  int channel_count;
  ChannelList *in_chanlist;
  bool pforce;
  int pnum;
  string pname;
  string fn;
  Header *h_1;
  int i;
  FrameBuffer input_framebuffer;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> output_framebuffers;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> output_headers;
  int parts;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
  output_channels;
  StringVector h;
  string hero;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
  input_channels;
  MultiPartInputFile infile;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  allocator_type *in_stack_fffffffffffffb60;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *this;
  size_type in_stack_fffffffffffffb68;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *in_stack_fffffffffffffb70;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *this_00;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
  *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  PixelType PVar18;
  int *in_stack_fffffffffffffbe8;
  bool *in_stack_fffffffffffffbf0;
  string *in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffc00;
  ulong uVar19;
  undefined1 local_2f0 [8];
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *local_2e8;
  InputPart local_2e0 [8];
  MultiPartOutputFile local_2d8 [16];
  Slice local_2c8 [16];
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
  *in_stack_fffffffffffffd48;
  MultiPartInputFile *in_stack_fffffffffffffd50;
  Slice local_290 [56];
  ulong local_258;
  reference local_250;
  undefined8 local_248;
  int local_23c;
  ulong local_238;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_228;
  int local_20c;
  int local_208;
  int local_200;
  int local_1fc;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *in_stack_fffffffffffffe20;
  byte local_185;
  string local_180 [32];
  string local_160 [32];
  Header *local_140;
  int local_134;
  string local_130 [16];
  string *in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffeef;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  *in_stack_fffffffffffffef0;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  *in_stack_fffffffffffffef8;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> local_f8;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_d8;
  MultiViewChannelName *local_c0;
  MultiViewChannelName *local_b8;
  int local_ac;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  string local_78 [32];
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_> local_58;
  MultiPartInputFile local_40 [39];
  byte local_19;
  char *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  sVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RDI);
  if (sVar5 != 1) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar6,"can only convert one file at once - use \'combine\' mode for multiple files")
    ;
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  ppcVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](in_RDI,0);
  pcVar1 = *ppcVar7;
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_40,pcVar1,iVar4,true);
  iVar4 = Imf_3_2::MultiPartInputFile::parts();
  if (iVar4 == 1) {
    std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
    vector((vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_> *)
           0x109931);
    std::__cxx11::string::string(local_78);
    pHVar8 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_40);
    bVar2 = Imf_3_2::hasMultiView(pHVar8);
    if ((bVar2 & 1) != 0) {
      pHVar8 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_40);
      Imf_3_2::multiView_abi_cxx11_(pHVar8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb98);
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_90);
      if (sVar5 != 0) {
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_90,0);
        std::__cxx11::string::operator=(local_78,(string *)pvVar9);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb60);
    }
    Imf_3_2::
    GetChannelsInMultiPartFile<std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
    vector((vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_> *)
           CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98);
    local_b8 = (MultiViewChannelName *)
               std::
               vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
               ::begin((vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                        *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    local_c0 = (MultiViewChannelName *)
               std::
               vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
               ::end((vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                      *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    local_ac = Imf_3_2::
               SplitChannels<__gnu_cxx::__normal_iterator<Imf_3_2::MultiViewChannelName*,std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>>
                         (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                          (bool)in_stack_fffffffffffffeef,in_stack_fffffffffffffee0);
    std::allocator<Imf_3_2::Header>::allocator((allocator<Imf_3_2::Header> *)0x109b06);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               (allocator_type *)in_stack_fffffffffffffb60);
    std::allocator<Imf_3_2::Header>::~allocator((allocator<Imf_3_2::Header> *)0x109b32);
    std::allocator<Imf_3_2::FrameBuffer>::allocator((allocator<Imf_3_2::FrameBuffer> *)0x109b57);
    std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::vector
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               (allocator_type *)in_stack_fffffffffffffb60);
    std::allocator<Imf_3_2::FrameBuffer>::~allocator((allocator<Imf_3_2::FrameBuffer> *)0x109b83);
    Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x109b90);
    for (local_134 = 0; local_134 < local_ac; local_134 = local_134 + 1) {
      local_140 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
                            (&local_d8,(long)local_134);
      pHVar8 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_40);
      Imf_3_2::Header::operator=(local_140,pHVar8);
      bVar2 = Imf_3_2::hasMultiView(local_140);
      if ((bVar2 & 1) != 0) {
        Imf_3_2::Header::erase((char *)local_140);
      }
      std::__cxx11::string::string(local_160);
      std::__cxx11::string::string(local_180);
      parse_filename(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                     in_stack_fffffffffffffbe8);
      bVar2 = Imf_3_2::Header::hasName();
      if (((bVar2 & 1) == 0) || ((local_185 & 1) != 0)) {
        Imf_3_2::Header::setName((string *)local_140);
      }
      Imf_3_2::ChannelList::ChannelList((ChannelList *)0x109d90);
      Imf_3_2::Header::channels();
      Imf_3_2::ChannelList::operator=
                ((ChannelList *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 (ChannelList *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      Imf_3_2::ChannelList::~ChannelList((ChannelList *)0x109dc9);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_160);
    }
    make_unique_names(in_stack_fffffffffffffe20);
    Imf_3_2::MultiPartInputFile::header((int)local_40);
    psVar10 = (string *)Imf_3_2::Header::channels();
    Imf_3_2::ChannelList::begin();
    while( true ) {
      Imf_3_2::ChannelList::end();
      bVar3 = Imf_3_2::operator!=((ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                                  (ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      if (!bVar3) break;
      Imf_3_2::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    }
    Imf_3_2::MultiPartInputFile::header((int)local_40);
    Imf_3_2::Header::dataWindow();
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
              ((Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
               (Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
              ((Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
              ((Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    local_1ec = (local_1f0 + 1) * (local_1fc + 1);
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
              ((Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    local_200 = local_208 + 1;
    local_20c = local_1e4 * local_200 + local_1e8;
    std::allocator<std::vector<char,_std::allocator<char>_>_>::allocator
              ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x10a03a);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    std::allocator<std::vector<char,_std::allocator<char>_>_>::~allocator
              ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x10a066);
    local_238 = 0;
    while (uVar19 = local_238,
          sVar5 = std::
                  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                  ::size(&local_58), uVar19 < sVar5) {
      pvVar11 = std::
                vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                ::operator[](&local_a8,local_238);
      local_23c = pvVar11->part_number;
      psVar12 = psVar10;
      std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
      operator[](&local_58,local_238);
      local_248 = Imf_3_2::ChannelList::find(psVar12);
      local_250 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
                            (&local_d8,(long)local_23c);
      psVar12 = (string *)Imf_3_2::Header::channels();
      pvVar11 = std::
                vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                ::operator[](&local_a8,local_238);
      Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x10a173);
      Imf_3_2::ChannelList::insert(psVar12,(Channel *)pvVar11);
      std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
      operator[](&local_a8,local_238);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                              (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48))
      ;
      pvVar16 = local_250;
      if (bVar3) {
        std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
        operator[](&local_a8,local_238);
        Imf_3_2::Header::setView((string *)pvVar16);
      }
      local_258 = 4;
      pCVar13 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x10a26f);
      if (*(int *)pCVar13 == 1) {
        local_258 = 2;
      }
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator[](&local_228,local_238);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffb70,
                 in_stack_fffffffffffffb68);
      psVar12 = (string *)
                std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::operator[]
                          (&local_f8,(long)local_23c);
      pvVar11 = std::
                vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                ::operator[](&local_a8,local_238);
      pCVar13 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x10a300);
      PVar18 = *(PixelType *)pCVar13;
      pvVar14 = std::
                vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ::operator[](&local_228,local_238);
      pvVar15 = std::vector<char,_std::allocator<char>_>::operator[](pvVar14,0);
      Imf_3_2::Slice::Slice
                (local_290,PVar18,pvVar15 + -((long)local_20c * local_258),local_258,
                 (long)local_200 * local_258,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert(psVar12,(Slice *)pvVar11);
      pvVar11 = std::
                vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                ::operator[](&local_58,local_238);
      pCVar13 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x10a3d0);
      PVar18 = *(PixelType *)pCVar13;
      pvVar14 = std::
                vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ::operator[](&local_228,local_238);
      pvVar15 = std::vector<char,_std::allocator<char>_>::operator[](pvVar14,0);
      in_stack_fffffffffffffb50 = 0;
      in_stack_fffffffffffffb48 = 1;
      Imf_3_2::Slice::Slice
                (local_2c8,PVar18,pvVar15 + -((long)local_20c * local_258),local_258,
                 (long)local_200 * local_258,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert(local_130,(Slice *)&pvVar11->internal_name);
      local_238 = local_238 + 1;
    }
    this_00 = &local_d8;
    pvVar16 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[](this_00,0);
    sVar5 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::size(this_00);
    iVar4 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
              (local_2d8,local_18,pvVar16,(int)sVar5,false,iVar4);
    Imf_3_2::InputPart::InputPart(local_2e0,local_40,0);
    Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)local_2e0);
    Imf_3_2::InputPart::readPixels((int)local_2e0,local_1e4);
    local_2e8 = (vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *)0x0;
    while (this = local_2e8,
          pvVar17 = (vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *)
                    std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::size
                              (&local_f8), this < pvVar17) {
      Imf_3_2::OutputPart::OutputPart((OutputPart *)local_2f0,local_2d8,(_Rb_tree_color)local_2e8);
      std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::operator[]
                (&local_f8,(size_type)local_2e8);
      Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)local_2f0);
      Imf_3_2::OutputPart::writePixels((int)local_2f0);
      local_2e8 = (vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *)
                  ((long)&(local_2e8->
                          super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(local_2d8);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               *)this);
    Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x10a648);
    std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::~vector(this);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)this);
    std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
    ~vector((vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_> *
            )this);
    std::__cxx11::string::~string(local_78);
    std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
    ~vector((vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_> *
            )this);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_40);
    return;
  }
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar6,
             "can only convert single part EXRs to multipart EXR-2.0 files: use \'split\' mode instead"
            );
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
convert (
    vector<const char*> in,
    vector<const char*> views,
    const char*         outname,
    bool                override)
{
    if (in.size () != 1)
        throw invalid_argument("can only convert one file at once - use 'combine' mode for multiple files");

    MultiPartInputFile infile (in[0]);
    
    if (infile.parts () != 1)
        throw invalid_argument("can only convert single part EXRs to multipart EXR-2.0 files: use 'split' mode instead");


    vector<MultiViewChannelName> input_channels;

    string hero;
    if (hasMultiView (infile.header (0)))
    {
        StringVector h = multiView (infile.header (0));
        if (h.size () > 0) { hero = h[0]; }
    }

    // retrieve channel names from input file in view-friendly format
    GetChannelsInMultiPartFile (infile, input_channels);

    vector<MultiViewChannelName> output_channels = input_channels;
    // remap channels to multiple output parts
    int parts = SplitChannels (
                               output_channels.begin (), output_channels.end (), true, hero);

    vector<Header>      output_headers (parts);
    vector<FrameBuffer> output_framebuffers (parts);
    FrameBuffer         input_framebuffer;

    //
    // make all output headers the same as the input header but
    // with no channels
    //
    for (int i = 0; i < parts; i++)
    {
        Header& h = output_headers[i];
        h         = infile.header (0);
        if (hasMultiView (h)) h.erase ("multiView");

        string fn, pname;
        int    pnum;
        bool   pforce;
        parse_filename (fn, pname, pforce, pnum);
        if (!h.hasName () || pforce) h.setName (pname);

        h.channels () = ChannelList ();
    }

    make_unique_names (output_headers);

    const ChannelList& in_chanlist = infile.header (0).channels ();

    int channel_count = 0;
    for (ChannelList::ConstIterator i = in_chanlist.begin ();
         i != in_chanlist.end ();
         ++i)
    {
        ++channel_count;
    }

    Box2i dataWindow = infile.header (0).dataWindow ();
    int   pixel_count =
        (dataWindow.size ().y + 1) * (dataWindow.size ().x + 1);
    int pixel_width = dataWindow.size ().x + 1;

    // offset in pixels between base of array and 0,0
    int pixel_base = dataWindow.min.y * pixel_width + dataWindow.min.x;

    vector<vector<char>> channelstore (channel_count);

    //
    // insert channels into correct header and framebuffers
    //
    for (size_t i = 0; i < input_channels.size (); i++)
    {
        // read the part we should be writing channel into, insert into header
        int                        part = output_channels[i].part_number;
        ChannelList::ConstIterator chan =
            in_chanlist.find (input_channels[i].internal_name);
        Header& h = output_headers[part];
        h.channels ().insert (output_channels[i].name, chan.channel ());

        if (output_channels[i].view != "")
        {
            h.setView (output_channels[i].view);
        }

        // compute size of channel
        size_t samplesize = sizeof (float);
        if (chan.channel ().type == HALF) { samplesize = sizeof (half); }
        channelstore[i].resize (samplesize * pixel_count);

        output_framebuffers[part].insert (output_channels[i].name,
                                          Slice (chan.channel ().type,
                                                 &channelstore[i][0] - pixel_base * samplesize,
                                                 samplesize,
                                                 pixel_width * samplesize));

        input_framebuffer.insert (input_channels[i].internal_name,
                                  Slice (chan.channel ().type,
                                         &channelstore[i][0] - pixel_base * samplesize,
                                         samplesize,
                                         pixel_width * samplesize));
    }

    //
    // create output file
    //
    MultiPartOutputFile outfile (outname, &output_headers[0], output_headers.size ());
                                 
    InputPart inpart (infile, 0);

    //
    // read file
    //
    inpart.setFrameBuffer (input_framebuffer);
    inpart.readPixels (dataWindow.min.y, dataWindow.max.y);

    //
    // write each part
    //

    for (size_t i = 0; i < output_framebuffers.size (); i++)
    {
        OutputPart outpart (outfile, i);
        outpart.setFrameBuffer (output_framebuffers[i]);
        outpart.writePixels (dataWindow.max.y + 1 - dataWindow.min.y);
    }
}